

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::DumpPortsTask::bindArgument
          (DumpPortsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  ExpressionSyntax *syntax_00;
  bool bVar1;
  Compilation *this_00;
  Compilation *compilation;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  bitmask<slang::ast::LookupFlags> local_3c;
  Args *local_38;
  Args *args_local;
  ExpressionSyntax *syntax_local;
  ASTContext *context_local;
  size_t argIndex_local;
  DumpPortsTask *this_local;
  
  local_38 = args;
  args_local = (Args *)syntax;
  syntax_local = (ExpressionSyntax *)context;
  context_local = (ASTContext *)argIndex;
  argIndex_local = (size_t)this;
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  extraLookupFlags.m_bits = (underlying_type)args;
  if (bVar1) {
    this_00 = ASTContext::getCompilation((ASTContext *)syntax_local);
    compilation = (Compilation *)
                  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>((SyntaxNode *)args_local)
    ;
    syntax_00 = syntax_local;
    memset(&local_3c,0,4);
    bitmask<slang::ast::LookupFlags>::bitmask(&local_3c);
    this_local = (DumpPortsTask *)
                 HierarchicalReferenceExpression::fromSyntax
                           ((HierarchicalReferenceExpression *)this_00,compilation,
                            (NameSyntax *)syntax_00,(ASTContext *)(ulong)local_3c.m_bits,
                            extraLookupFlags);
  }
  else {
    this_local = (DumpPortsTask *)
                 SystemSubroutine::bindArgument
                           ((SystemSubroutine *)this,(size_t)context_local,
                            (ASTContext *)syntax_local,(ExpressionSyntax *)args_local,local_38);
  }
  return (Expression *)this_local;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (NameSyntax::isKind(syntax.kind)) {
            return HierarchicalReferenceExpression::fromSyntax(context.getCompilation(),
                                                               syntax.as<NameSyntax>(), context);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }